

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O2

Vec_Ptr_t * Mpm_ManFindCells(Mio_Library_t *pMio,SC_Lib *pScl,Vec_Wec_t *vNpnConfigs)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  void **__s;
  Vec_Int_t *p_00;
  undefined8 *puVar3;
  Mio_Gate_t *pMVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = vNpnConfigs->nSize;
  lVar5 = (long)iVar2;
  p = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar2 - 1U) {
    iVar1 = iVar2;
  }
  p->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar1 << 3);
  }
  p->pArray = __s;
  p->nSize = iVar2;
  lVar6 = 0;
  memset(__s,0,lVar5 * 8);
  do {
    if (iVar2 <= lVar6) {
      return p;
    }
    p_00 = Vec_WecEntry(vNpnConfigs,(int)lVar6);
    if (p_00->nSize != 0) {
      iVar2 = Vec_IntEntry(p_00,0);
      puVar3 = (undefined8 *)Vec_PtrEntry(&pScl->vCells,iVar2 >> 0x11);
      pMVar4 = Mio_LibraryReadGateByName(pMio,(char *)*puVar3,(char *)0x0);
      if (pMVar4 == (Mio_Gate_t *)0x0) {
        Vec_PtrFree(p);
        return (Vec_Ptr_t *)0x0;
      }
      if (lVar5 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      __s[lVar6] = pMVar4;
    }
    lVar6 = lVar6 + 1;
    iVar2 = vNpnConfigs->nSize;
  } while( true );
}

Assistant:

Vec_Ptr_t * Mpm_ManFindCells( Mio_Library_t * pMio, SC_Lib * pScl, Vec_Wec_t * vNpnConfigs )
{
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vClass;
    Mio_Gate_t * pMioGate;
    SC_Cell * pCell;
    int Config, iClass;
    vNpnGatesMio = Vec_PtrStart( Vec_WecSize(vNpnConfigs) );
    Vec_WecForEachLevel( vNpnConfigs, vClass, iClass )
    {
        if ( Vec_IntSize(vClass) == 0 )
            continue;
        Config = Vec_IntEntry(vClass, 0);
        pCell = SC_LibCell( pScl, (Config >> 17) );
        pMioGate = Mio_LibraryReadGateByName( pMio, pCell->pName, NULL );
        if ( pMioGate == NULL )
        {
            Vec_PtrFree( vNpnGatesMio );
            return NULL;
        }
        assert( pMioGate != NULL );
        Vec_PtrWriteEntry( vNpnGatesMio, iClass, pMioGate );
    }
    return vNpnGatesMio;
}